

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdarg.c
# Opt level: O0

int test(int s,...)

{
  longdouble lVar1;
  char in_AL;
  int iVar2;
  longdouble *plVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_260;
  long *local_248;
  int *local_230;
  undefined8 *local_218;
  int *local_200;
  undefined8 *local_1e8;
  int *local_1d0;
  int *local_1b8;
  double *local_1a0;
  int *local_180;
  long *local_168;
  int *local_150;
  long *local_138;
  int *local_120;
  int *local_108;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  code *local_30;
  intfunc_t function;
  va_list ap;
  int s_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_e8;
  ap[0]._0_8_ = &stack0x00000008;
  function._4_4_ = 0x30;
  function._0_4_ = 8;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  ap[0].reg_save_area._4_4_ = s;
  do {
    switch(ap[0].reg_save_area._4_4_) {
    case 0:
      return 0;
    case 1:
      if ((uint)function < 0x29) {
        local_108 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_108 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      if (*local_108 != 0x7fffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x2b,"va_arg( ap, int ) == INT_MAX");
      }
      if ((uint)function < 0x29) {
        local_120 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_120 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_120;
      break;
    case 2:
      if ((uint)function < 0x29) {
        local_138 = (long *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_138 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      if (*local_138 != 0x7fffffffffffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x32,"va_arg( ap, long ) == LONG_MAX");
      }
      if ((uint)function < 0x29) {
        local_150 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_150 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_150;
      break;
    case 3:
      if ((uint)function < 0x29) {
        local_168 = (long *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_168 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      if (*local_168 != 0x7fffffffffffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x39,"va_arg( ap, long long ) == LLONG_MAX");
      }
      if ((uint)function < 0x29) {
        local_180 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_180 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_180;
      break;
    case 4:
      if (function._4_4_ < 0xa1) {
        local_1a0 = (double *)((long)(int)function._4_4_ + (long)ap[0].overflow_arg_area);
        function._4_4_ = function._4_4_ + 0x10;
      }
      else {
        local_1a0 = (double *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      if ((*local_1a0 != 1.79769313486232e+308) || (NAN(*local_1a0))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x40,"va_arg( ap, double ) == DBL_MAX");
      }
      if ((uint)function < 0x29) {
        local_1b8 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_1b8 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_1b8;
      break;
    case 5:
      plVar3 = (longdouble *)(ap[0]._0_8_ + 0xf & 0xfffffffffffffff0);
      ap[0]._0_8_ = plVar3 + 1;
      lVar1 = *plVar3;
      if ((lVar1 != _DAT_00102010) || (NAN(lVar1) || NAN(_DAT_00102010))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x47,"va_arg( ap, long double ) == LDBL_MAX");
      }
      if ((uint)function < 0x29) {
        local_1d0 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_1d0 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_1d0;
      break;
    case 6:
      if ((uint)function < 0x29) {
        local_1e8 = (undefined8 *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_1e8 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      if (*(int *)*local_1e8 != 0x7fffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x4e,"*( va_arg( ap, int * ) ) == INT_MAX");
      }
      if ((uint)function < 0x29) {
        local_200 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_200 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_200;
      break;
    case 7:
      if ((uint)function < 0x29) {
        local_218 = (undefined8 *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_218 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      if ((*(longdouble *)*local_218 != _DAT_00102010) ||
         (NAN(*(longdouble *)*local_218) || NAN(_DAT_00102010))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x55,"*( va_arg( ap, long double * ) ) == LDBL_MAX");
      }
      if ((uint)function < 0x29) {
        local_230 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_230 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_230;
      break;
    case 8:
      if ((uint)function < 0x29) {
        local_248 = (long *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_248 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      local_30 = (code *)*local_248;
      if (local_30 != dummy) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x5d,"( function = va_arg( ap, intfunc_t ) ) == dummy");
      }
      iVar2 = (*local_30)();
      if (iVar2 != 0x7fffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x5e,"function() == INT_MAX");
      }
      if ((uint)function < 0x29) {
        local_260 = (int *)((long)(int)(uint)function + (long)ap[0].overflow_arg_area);
        function._0_4_ = (uint)function + 8;
      }
      else {
        local_260 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      ap[0].reg_save_area._4_4_ = *local_260;
    }
  } while( true );
}

Assistant:

static int test( int s, ... )
{
    va_list ap;
    va_start( ap, s );

    for ( ;; )
    {
        switch ( s )
        {
            case TAG_INT:
            {
                TESTCASE( va_arg( ap, int ) == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LONG:
            {
                TESTCASE( va_arg( ap, long ) == LONG_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LLONG:
            {
                TESTCASE( va_arg( ap, long long ) == LLONG_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_DBL:
            {
                TESTCASE( va_arg( ap, double ) == DBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LDBL:
            {
                TESTCASE( va_arg( ap, long double ) == LDBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_INTPTR:
            {
                TESTCASE( *( va_arg( ap, int * ) ) == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LDBLPTR:
            {
                TESTCASE( *( va_arg( ap, long double * ) ) == LDBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_FUNCPTR:
            {
                intfunc_t function;
                TESTCASE( ( function = va_arg( ap, intfunc_t ) ) == dummy );
                TESTCASE( function() == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_END:
            {
                va_end( ap );
                return 0;
            }
        }
    }
}